

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Node * prvTidyParseRowGroup(TidyDocImpl *doc,Node *rowgroup,GetTokenMode mode)

{
  int iVar1;
  Lexer *pLVar2;
  TidyParserMemory *pTVar3;
  Dict *pDVar4;
  bool bVar5;
  Bool BVar6;
  long lVar7;
  Node *node;
  TidyDocImpl *pTVar8;
  Node *extraout_RDX;
  Node *extraout_RDX_00;
  Node *pNVar9;
  int iVar10;
  TidyParserMemory memory;
  Node *local_70;
  undefined8 uStack_50;
  
  pLVar2 = doc->lexer;
  if (rowgroup == (Node *)0x0) {
    iVar1 = (doc->stack).top;
    lVar7 = (long)iVar1;
    if (lVar7 < 0) {
      rowgroup = (Node *)0x0;
      node = (Node *)0x0;
      iVar10 = 0;
    }
    else {
      pTVar3 = (doc->stack).content;
      rowgroup = pTVar3[lVar7].original_node;
      node = pTVar3[lVar7].reentry_node;
      iVar10 = pTVar3[lVar7].reentry_state;
      (doc->stack).top = iVar1 + -1;
    }
  }
  else {
    node = (Node *)0x0;
    iVar10 = 0;
    local_70 = (Node *)0x0;
    if ((rowgroup->tag->model & 1) != 0) {
      return (Node *)0x0;
    }
  }
  do {
    if (iVar10 == 2) {
      return (Node *)0x0;
    }
    do {
      while( true ) {
        if (iVar10 == 0) {
          node = prvTidyGetToken(doc,IgnoreWhitespace);
        }
        if (iVar10 != 1) break;
        pLVar2->exiled = no;
        iVar10 = 0;
      }
    } while (iVar10 != 0);
    bVar5 = true;
    if (node == (Node *)0x0) {
      iVar10 = 2;
      node = (Node *)0x0;
      goto LAB_0013e106;
    }
    pDVar4 = node->tag;
    if (pDVar4 == (((TidyDocImpl *)rowgroup)->root).tag) {
      if (node->type != EndTag) goto LAB_0013e0f2;
      (((TidyDocImpl *)rowgroup)->root).closed = yes;
      prvTidyFreeNode(doc,node);
LAB_0013e0fa:
      local_70 = (Node *)0x0;
      bVar5 = false;
    }
    else {
      if (((pDVar4 != (Dict *)0x0) && (pDVar4->id == TidyTag_TABLE)) && (node->type == EndTag))
      goto LAB_0013e0f2;
      BVar6 = InsertMisc(rowgroup,node);
      if (BVar6 != no) goto LAB_0013e106;
      pDVar4 = node->tag;
      if ((pDVar4 == (Dict *)0x0) && (node->type != TextNode)) {
LAB_0013e0d0:
        prvTidyReport(doc,rowgroup,node,0x235);
        prvTidyFreeNode(doc,node);
        goto LAB_0013e106;
      }
      if (node->type == EndTag) {
LAB_0013df65:
        if (node->type == EndTag) {
          if ((((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
              (node->tag->id != TidyTag_FORM)) && (BVar6 = prvTidynodeHasCM(node,0x18), BVar6 == no)
             ) {
            pTVar8 = (TidyDocImpl *)rowgroup;
            if (((node == (Node *)0x0) || (pDVar4 = node->tag, pDVar4 == (Dict *)0x0)) ||
               ((pDVar4->id != TidyTag_TR &&
                ((pDVar4 == (Dict *)0x0 ||
                 ((pDVar4->id != TidyTag_TD &&
                  ((pDVar4 == (Dict *)0x0 || (pDVar4->id != TidyTag_TH)))))))))) {
              do {
                pTVar8 = (TidyDocImpl *)(pTVar8->root).parent;
                if (pTVar8 == (TidyDocImpl *)0x0) goto LAB_0013e0b5;
              } while (node->tag != (pTVar8->root).tag);
              goto LAB_0013e0f2;
            }
          }
          else if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) &&
                  (node->tag->id == TidyTag_FORM)) {
            *(byte *)&doc->badForm = (byte)doc->badForm | 1;
          }
          goto LAB_0013e0d0;
        }
LAB_0013e0b5:
        pDVar4 = node->tag;
        if (((pDVar4->model & 0x100) != 0) && (node->type != EndTag)) {
LAB_0013e0f2:
          prvTidyUngetToken(doc);
          goto LAB_0013e0fa;
        }
        if (node->type == EndTag) goto LAB_0013e0d0;
        if ((pDVar4 == (Dict *)0x0 || node == (Node *)0x0) || (pDVar4->id != TidyTag_TR)) {
          node = prvTidyInferredTag(doc,TidyTag_TR);
          prvTidyReport(doc,rowgroup,node,0x261);
          prvTidyUngetToken(doc);
        }
        node->parent = rowgroup;
        if ((TidyDocImpl *)rowgroup == (TidyDocImpl *)0x0) {
          node->prev = (Node *)0x0;
LAB_0013e181:
          if ((TidyDocImpl *)rowgroup != (TidyDocImpl *)0x0) {
            (((TidyDocImpl *)rowgroup)->root).content = node;
LAB_0013e18a:
            (((TidyDocImpl *)rowgroup)->root).last = node;
          }
        }
        else {
          pNVar9 = (((TidyDocImpl *)rowgroup)->root).last;
          node->prev = pNVar9;
          if (pNVar9 == (Node *)0x0) goto LAB_0013e181;
          pNVar9->next = node;
          if ((TidyDocImpl *)rowgroup != (TidyDocImpl *)0x0) goto LAB_0013e18a;
        }
        uStack_50 = 0;
      }
      else {
        if ((pDVar4 != (Dict *)0x0) &&
           ((pDVar4->id == TidyTag_TD || ((pDVar4 != (Dict *)0x0 && (pDVar4->id == TidyTag_TH))))))
        {
          prvTidyUngetToken(doc);
          node = prvTidyInferredTag(doc,TidyTag_TR);
          prvTidyReport(doc,rowgroup,node,0x261);
          goto LAB_0013df65;
        }
        BVar6 = prvTidynodeIsText(node);
        pNVar9 = extraout_RDX;
        if ((BVar6 == no) &&
           (BVar6 = prvTidynodeHasCM(node,0x18), pNVar9 = extraout_RDX_00, BVar6 == no)) {
          if ((node->tag->model & 4) == 0) goto LAB_0013df65;
          prvTidyReport(doc,rowgroup,node,0x27e);
          MoveToHead(doc,rowgroup,node);
          goto LAB_0013e106;
        }
        MoveBeforeTable((TidyDocImpl *)rowgroup,node,pNVar9);
        prvTidyReport(doc,rowgroup,node,0x27e);
        pLVar2->exiled = yes;
        if (node->type == TextNode) {
          iVar10 = 1;
          goto LAB_0013e106;
        }
        uStack_50 = 0x100000000;
      }
      prvTidypushMemory(doc,(TidyParserMemory)
                            ZEXT3248(CONCAT824(uStack_50,
                                               CONCAT816(node,CONCAT88(rowgroup,prvTidyParseRowGroup
                                                                      )))));
      bVar5 = false;
      local_70 = node;
    }
LAB_0013e106:
    if (!bVar5) {
      return local_70;
    }
  } while( true );
}

Assistant:

Node* TY_(ParseRowGroup)( TidyDocImpl* doc, Node *rowgroup, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Node *parent = NULL;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_POST_NOT_TEXTNODE,      /* To-do after re-entering after checks. */
        STATE_COMPLETE,               /* Done with the switch. */
    } state = STATE_INITIAL;

    if ( rowgroup == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        rowgroup = memory.original_node;
        state = memory.reentry_state;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(rowgroup);
        if (rowgroup->tag->model & CM_EMPTY)
        {
            DEBUG_LOG_EXIT;
            return NULL;
        }
    }

    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL )
            node = TY_(GetToken)(doc, IgnoreWhitespace);
        
        switch (state)
        {
            case STATE_INITIAL:
            {
                TidyParserMemory memory = {0};

                if (node == NULL)
                {
                    state = STATE_COMPLETE;
                    continue;
                }
                
                if (node->tag == rowgroup->tag)
                {
                    if (node->type == EndTag)
                    {
                        rowgroup->closed = yes;
                        TY_(FreeNode)( doc, node);
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    TY_(UngetToken)( doc );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                /* if </table> infer end tag */
                if ( nodeIsTABLE(node) && node->type == EndTag )
                {
                    TY_(UngetToken)( doc );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                /* deal with comments etc. */
                if (InsertMisc(rowgroup, node))
                    continue;

                /* discard unknown tags */
                if (node->tag == NULL && node->type != TextNode)
                {
                    TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /*
                  if TD or TH then infer <TR>
                  if text or inline or block move before table
                  if head content move to head
                */

                if (node->type != EndTag)
                {
                    if ( nodeIsTD(node) || nodeIsTH(node) )
                    {
                        TY_(UngetToken)( doc );
                        node = TY_(InferredTag)(doc, TidyTag_TR);
                        TY_(Report)(doc, rowgroup, node, MISSING_STARTTAG);
                    }
                    else if ( TY_(nodeIsText)(node)
                              || TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
                    {
                        MoveBeforeTable( doc, rowgroup, node );
                        TY_(Report)(doc, rowgroup, node, TAG_NOT_ALLOWED_IN);
                        lexer->exiled = yes;

                        if (node->type != TextNode)
                        {
                            memory.identity = TY_(ParseRowGroup);
                            memory.original_node = rowgroup;
                            memory.reentry_node = node;
                            memory.reentry_state = STATE_POST_NOT_TEXTNODE;
                            TY_(pushMemory)( doc, memory );
                            DEBUG_LOG_EXIT_WITH_NODE(node);
                            return node;
                        }
                        
                        state = STATE_POST_NOT_TEXTNODE;
                        continue;
                    }
                    else if (node->tag->model & CM_HEAD)
                    {
                        TY_(Report)(doc, rowgroup, node, TAG_NOT_ALLOWED_IN);
                        MoveToHead(doc, rowgroup, node);
                        continue;
                    }
                }

                /*
                  if this is the end tag for ancestor element
                  then infer end tag for this element
                */
                if (node->type == EndTag)
                {
                    if ( nodeIsFORM(node) || TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
                    {
                        if ( nodeIsFORM(node) )
                            BadForm( doc );

                        TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    if ( nodeIsTR(node) || nodeIsTD(node) || nodeIsTH(node) )
                    {
                        TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    for ( parent = rowgroup->parent;
                          parent != NULL;
                          parent = parent->parent )
                    {
                        if (node->tag == parent->tag)
                        {
                            TY_(UngetToken)( doc );
                            DEBUG_LOG_EXIT;
                            return NULL;
                        }
                    }
                }

                /*
                  if THEAD, TFOOT or TBODY then implied end tag

                */
                if (node->tag->model & CM_ROWGRP)
                {
                    if (node->type != EndTag)
                    {
                        TY_(UngetToken)( doc );
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }
                }

                if (node->type == EndTag)
                {
                    TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                if ( !nodeIsTR(node) )
                {
                    node = TY_(InferredTag)(doc, TidyTag_TR);
                    TY_(Report)(doc, rowgroup, node, MISSING_STARTTAG);
                    TY_(UngetToken)( doc );
                }

               /* node should be <TR> */
                TY_(InsertNodeAtEnd)(rowgroup, node);
                memory.identity = TY_(ParseRowGroup);
                memory.original_node = rowgroup;
                memory.reentry_node = node;
                memory.reentry_state = STATE_INITIAL;
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            } break;
                
                
            case STATE_POST_NOT_TEXTNODE:
            {
                lexer->exiled = no;
                state = STATE_INITIAL;
                continue;
            } break;

                
            default:
                break;
        } /* switch */
    } /* while */
    DEBUG_LOG_EXIT;
    return NULL;
}